

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed)

{
  Nonnull<const_char_*> pcVar1;
  undefined7 in_register_00000011;
  ExtensionInfo info;
  ExtensionInfo local_58;
  
  if ((int)CONCAT71(in_register_00000011,type) == 0xe) {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_char,long>
                       (type,0xe,"type != WireFormatLite::TYPE_ENUM");
  }
  else {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    if (type == '\v') {
      pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_char,long>
                         ('\v',0xb,"type != WireFormatLite::TYPE_MESSAGE");
    }
    else {
      pcVar1 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar1 == (Nonnull<const_char_*>)0x0) {
      if (type == '\n') {
        pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_char,long>
                           ('\n',10,"type != WireFormatLite::TYPE_GROUP");
      }
      else {
        pcVar1 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar1 == (Nonnull<const_char_*>)0x0) {
        local_58._15_8_ = 0;
        local_58.field_6._7_8_ = 0;
        local_58._31_8_ = 0;
        local_58._39_8_ = 0;
        local_58.lazy_eager_verify_func._7_1_ = 0;
        local_58.message = extendee;
        local_58.number = number;
        local_58.type = type;
        local_58.is_repeated = is_repeated;
        local_58.is_packed = is_packed;
        anon_unknown_59::Register(&local_58);
        return;
      }
      goto LAB_00f806ba;
    }
  }
  else {
    RegisterExtension();
  }
  RegisterExtension();
LAB_00f806ba:
  RegisterExtension();
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* extendee, int number,
                                     FieldType type, bool is_repeated,
                                     bool is_packed) {
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  Register(info);
}